

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionElement,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcElement *this;
  
  this = (IfcElement *)operator_new(0x160);
  *(undefined ***)&this->field_0x148 = &PTR__Object_00806870;
  *(undefined8 *)&this[1].super_IfcProduct.super_IfcObject = 0;
  *(char **)&this[1].super_IfcProduct.super_IfcObject.field_0x8 = "IfcDistributionElement";
  Assimp::IFC::Schema_2x3::IfcElement::IfcElement(this,&PTR_construction_vtable_24__008102a8);
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject = &PTR__IfcDistributionElement_008101a0;
  *(undefined ***)&this->field_0x148 = &PTR__IfcDistributionElement_00810290;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0x88 =
       &PTR__IfcDistributionElement_008101c8;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDistributionElement_008101f0;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0xd0 =
       &PTR__IfcDistributionElement_00810218;
  *(undefined ***)&(this->super_IfcProduct).field_0x100 = &PTR__IfcDistributionElement_00810240;
  *(undefined ***)&this->field_0x138 = &PTR__IfcDistributionElement_00810268;
  GenericFill<Assimp::IFC::Schema_2x3::IfcElement>(db,params,this);
  return (Object *)
         (&(this->super_IfcProduct).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcProduct).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }